

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_psllw_mips64(uint64_t fs,uint64_t ft)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  LMIValue vs;
  
  uVar3 = (uint)ft & 0x7f;
  if (0x1f < uVar3) {
    return 0;
  }
  vs.d = fs;
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)&vs + lVar2 * 4);
    *piVar1 = *piVar1 << ((byte)uVar3 & 0x1f);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return vs.d;
}

Assistant:

uint64_t helper_psllw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] <<= ft;
    }
    return vs.d;
}